

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

int __thiscall CImage::Save(CImage *this,char *szFilename)

{
  int iVar1;
  char *__s1;
  
  if (szFilename == (char *)0x0) {
    iVar1 = 0x3d;
  }
  else {
    __s1 = strrchr(szFilename,0x2e);
    if ((__s1 != (char *)0x0) && (iVar1 = strcasecmp(__s1,".tga"), iVar1 == 0)) {
      iVar1 = 0;
      if (this->m_BitPerPixel == 0x10) {
        iVar1 = ConvertTo24(this);
      }
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = SaveTga(this,szFilename,true);
      return iVar1;
    }
    if ((this->m_BitPerPixel == 0x20) || (iVar1 = 0, this->m_BitPerPixel == 0x10)) {
      iVar1 = ConvertTo24(this);
    }
    if (iVar1 == 0) {
      iVar1 = SaveBmp(this,szFilename);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int DLL CImage::Save(char *szFilename)
{
  int nRes = 0;
  int nNotTGA = 1;

  if ( szFilename != NULL ) 
  {
    char * szExt = strrchr( szFilename, '.' );

    if ( szExt != NULL ) 
      nNotTGA = _stricmp( szExt, ".tga" );

    if ( nNotTGA != 0 )
    {
      if (( m_BitPerPixel == 16 ) || ( m_BitPerPixel == 32 ))
        nRes = ConvertTo24();

      if (nRes == 0)
        nRes = SaveBmp( szFilename );
    }
    else
    {
      if ( m_BitPerPixel == 16 )
        nRes = ConvertTo24();

      if (nRes == 0)
        nRes = SaveTga( szFilename, true );
    }
  }
  else
    nRes = eSaveFilename;

  return nRes;
}